

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FileClassPrefix_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  PrefixModeStorage *this_00;
  bool bVar1;
  FileOptions *pFVar2;
  string *psVar3;
  ulong uVar4;
  AlphaNum *b;
  undefined1 in_R8B;
  string_view sVar5;
  undefined1 auVar6 [16];
  AlphaNum local_198;
  AlphaNum *local_168;
  char *local_160;
  AlphaNum local_158;
  undefined4 local_124;
  undefined1 local_120 [16];
  undefined1 local_110 [8];
  string part;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *segment;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  ConvertibleToStringView local_b8;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segments;
  string result;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  undefined1 local_28 [8];
  string_view objc_class_prefix;
  FileDescriptor *file_local;
  
  objc_class_prefix._M_str = (char *)this;
  pFVar2 = FileDescriptor::options((FileDescriptor *)this);
  bVar1 = FileOptions::has_objc_class_prefix(pFVar2);
  if (bVar1) {
    pFVar2 = FileDescriptor::options((FileDescriptor *)objc_class_prefix._M_str);
    psVar3 = FileOptions::objc_class_prefix_abi_cxx11_(pFVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    _local_28 = anon_unknown_0::PrefixModeStorage::prefix_from_proto_package_mappings
                          ((anonymous_namespace)::g_prefix_mode,
                           (FileDescriptor *)objc_class_prefix._M_str);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
    if (bVar1) {
      bVar1 = anon_unknown_0::PrefixModeStorage::use_package_name
                        ((anonymous_namespace)::g_prefix_mode);
      this_00 = (anonymous_namespace)::g_prefix_mode;
      if (bVar1) {
        sVar5 = FileDescriptor::package((FileDescriptor *)objc_class_prefix._M_str);
        bVar1 = anon_unknown_0::PrefixModeStorage::is_package_exempted(this_00,sVar5);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,anon_var_dwarf_37cdd0 + 5,
                     (allocator<char> *)(result.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(result.field_2._M_local_buf + 0xf));
        }
        else {
          std::__cxx11::string::string
                    ((string *)
                     &segments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar5 = FileDescriptor::package((FileDescriptor *)objc_class_prefix._M_str);
          absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
                    (&local_b8,sVar5);
          absl::lts_20250127::StrSplit<char,absl::lts_20250127::SkipEmpty>
                    (&local_a8,(lts_20250127 *)local_b8.value_._M_len,local_b8.value_._M_str,0x2e);
          absl::lts_20250127::strings_internal::
          Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::
          operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,&local_a8);
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_90);
          segment = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_90);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&segment);
            if (!bVar1) break;
            part.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
            auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)part.field_2._8_8_);
            sVar5._M_len = auVar6._8_8_;
            sVar5._M_str = (char *)0x1;
            local_120 = auVar6;
            (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                      ((string *)local_110,auVar6._0_8_,sVar5,(bool)in_R8B);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                std::__cxx11::string::append
                          ((char *)&segments.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              std::__cxx11::string::append
                        ((string *)
                         &segments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_124 = 0;
            }
            else {
              local_124 = 3;
            }
            std::__cxx11::string::~string((string *)local_110);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::__cxx11::string::append
                      ((char *)&segments.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          sVar5 = anon_unknown_0::PrefixModeStorage::forced_package_prefix
                            ((anonymous_namespace)::g_prefix_mode);
          local_160 = sVar5._M_str;
          b = (AlphaNum *)sVar5._M_len;
          local_168 = b;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_158,sVar5);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &segments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          absl::lts_20250127::StrCat_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)&local_158,&local_198,b);
          local_124 = 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_90);
          std::__cxx11::string::~string
                    ((string *)
                     &segments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,anon_var_dwarf_37cdd0 + 5,local_3d);
        std::allocator<char>::~allocator(local_3d);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_28,&local_29);
      std::allocator<char>::~allocator(&local_29);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassPrefix(const FileDescriptor* file) {
  // Always honor the file option.
  if (file->options().has_objc_class_prefix()) {
    return file->options().objc_class_prefix();
  }

  // If package prefix is specified in an prefix to proto mappings file then use
  // that.
  absl::string_view objc_class_prefix =
      g_prefix_mode.prefix_from_proto_package_mappings(file);
  if (!objc_class_prefix.empty()) {
    return std::string(objc_class_prefix);
  }

  // If package prefix isn't enabled, done.
  if (!g_prefix_mode.use_package_name()) {
    return "";
  }

  // If the package is in the exceptions list, done.
  if (g_prefix_mode.is_package_exempted(file->package())) {
    return "";
  }

  // Transform the package into a prefix: use the dot segments as part,
  // camelcase each one and then join them with underscores, and add an
  // underscore at the end.
  std::string result;
  const std::vector<std::string> segments =
      absl::StrSplit(file->package(), '.', absl::SkipEmpty());
  for (const auto& segment : segments) {
    const std::string part = UnderscoresToCamelCase(segment, true);
    if (part.empty()) {
      continue;
    }
    if (!result.empty()) {
      result.append("_");
    }
    result.append(part);
  }
  if (!result.empty()) {
    result.append("_");
  }
  return absl::StrCat(g_prefix_mode.forced_package_prefix(), result);
}